

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       format_decimal<char,unsigned_long,char*,fmt::v5::internal::no_thousands_sep>
                 (char *out,undefined8 value,int num_digits)

{
  char *end_00;
  type pcVar1;
  char *end;
  char_type buffer [26];
  int num_digits_local;
  unsigned_long value_local;
  char *out_local;
  
  if (num_digits < 0) {
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3dd,
                  "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = char, UInt = unsigned long, Iterator = char *, ThousandsSep = fmt::internal::no_thousands_sep]"
                 );
  }
  end_00 = format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>
                     (&end,value,num_digits);
  pcVar1 = copy_str<char,char*,char*>((char *)&end,end_00,out);
  return pcVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}